

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O0

String * Rml::Parse::VariableExpression
                   (String *__return_storage_ptr__,DataParser *parser,String *address_prefix)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr___00;
  char cVar1;
  ulong uVar2;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  ProgramState PVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  Variant local_1e0;
  undefined1 local_1b8 [8];
  String next;
  allocator<char> local_171;
  Variant local_170;
  Variant local_148;
  allocator<char> local_119;
  String local_118;
  String local_f8;
  Variant local_d8;
  Variant local_b0;
  undefined4 local_84;
  undefined1 local_80 [8];
  String index;
  ProgramState backup_state;
  undefined1 local_40 [8];
  String prefix;
  String *address_prefix_local;
  DataParser *parser_local;
  
  prefix.field_2._8_8_ = address_prefix;
  cVar1 = DataParser::Look(parser);
  if (cVar1 == '[') {
    DataParser::Next(parser);
    ::std::__cxx11::string::string((string *)local_40,(string *)prefix.field_2._8_8_);
    ::std::__cxx11::string::push_back((char)(string *)local_40);
    PVar3 = DataParser::GetProgramState(parser);
    index.field_2._8_8_ = PVar3.program_length;
    FindNumberLiteral_abi_cxx11_((String *)local_80,(Parse *)parser,(DataParser *)0x1,(bool)in_CL);
    uVar2 = ::std::__cxx11::string::empty();
    if (((uVar2 & 1) == 0) && (cVar1 = DataParser::Look(parser), cVar1 == ']')) {
      DataParser::Next(parser);
      ::std::__cxx11::string::append((string *)local_40);
      ::std::__cxx11::string::push_back((char)local_40);
      VariableExpression(__return_storage_ptr__,parser,(String *)local_40);
    }
    else {
      DataParser::SetProgramState(parser,(ProgramState *)((long)&index.field_2 + 8));
      Variant::Variant<std::__cxx11::string&,void>
                (&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
      DataParser::Emit(parser,Literal,&local_b0);
      Variant::~Variant(&local_b0);
      DataParser::Push(parser);
      Expression(parser);
      Variant::Variant(&local_d8);
      DataParser::Emit(parser,CastToInt,&local_d8);
      Variant::~Variant(&local_d8);
      DataParser::Push(parser);
      DataParser::Match(parser,']',true);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"]",&local_119);
      VariableExpression(&local_f8,parser,&local_118);
      ::std::__cxx11::string::~string((string *)&local_f8);
      ::std::__cxx11::string::~string((string *)&local_118);
      ::std::allocator<char>::~allocator(&local_119);
      DataParser::Pop(parser,L);
      Variant::Variant(&local_148);
      DataParser::Emit(parser,Add,&local_148);
      Variant::~Variant(&local_148);
      DataParser::Pop(parser,L);
      Variant::Variant(&local_170);
      DataParser::Emit(parser,Add,&local_170);
      Variant::~Variant(&local_170);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",&local_171);
      ::std::allocator<char>::~allocator(&local_171);
    }
    local_84 = 1;
    ::std::__cxx11::string::~string((string *)local_80);
    ::std::__cxx11::string::~string((string *)local_40);
    return __return_storage_ptr__;
  }
  cVar1 = DataParser::Look(parser);
  if (cVar1 == '.') {
    DataParser::Next(parser);
    __return_storage_ptr___00 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((long)&next.field_2 + 8);
    ::std::operator+(__return_storage_ptr___00,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     prefix.field_2._8_8_,".");
    VariableExpression(__return_storage_ptr__,parser,__return_storage_ptr___00);
    ::std::__cxx11::string::~string((string *)(next.field_2._M_local_buf + 8));
    return __return_storage_ptr__;
  }
  VariableOrFunctionName_abi_cxx11_
            ((String *)local_1b8,(Parse *)parser,(DataParser *)0x0,
             (bool *)CONCAT71(in_register_00000009,in_CL));
  uVar2 = ::std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    ::std::operator+(&local_200,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     prefix.field_2._8_8_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8)
    ;
    VariableExpression(__return_storage_ptr__,parser,&local_200);
    ::std::__cxx11::string::~string((string *)&local_200);
  }
  else {
    uVar2 = ::std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      Variant::Variant<std::__cxx11::string_const&,void>
                (&local_1e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 prefix.field_2._8_8_);
      DataParser::Emit(parser,Literal,&local_1e0);
      Variant::~Variant(&local_1e0);
    }
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)prefix.field_2._8_8_);
  }
  local_84 = 1;
  ::std::__cxx11::string::~string((string *)local_1b8);
  return __return_storage_ptr__;
}

Assistant:

static String VariableExpression(DataParser& parser, const String& address_prefix)
	{
		if (parser.Look() == '[')
		{
			parser.Next();
			String prefix = address_prefix;

			prefix.push_back('[');

			// Backup program state before trying to parse number inside brackets.
			// Could turn out to be expression and needs reparsing
			auto backup_state = parser.GetProgramState();

			String index = FindNumberLiteral(parser, true);
			if (!index.empty() && parser.Look() == ']')
			{
				parser.Next();
				prefix.append(index);
				prefix.push_back(']');
				return VariableExpression(parser, prefix);
			}
			else
			{
				parser.SetProgramState(backup_state);

				parser.Emit(Instruction::Literal, Variant(prefix));
				parser.Push();

				Expression(parser);
				parser.Emit(Instruction::CastToInt);
				parser.Push();

				parser.Match(']');
				VariableExpression(parser, "]");

				parser.Pop(Register::L);
				parser.Emit(Instruction::Add, Variant());
				parser.Pop(Register::L);
				parser.Emit(Instruction::Add, Variant());

				return "";
			}
		}
		else if (parser.Look() == '.')
		{
			parser.Next();
			return VariableExpression(parser, address_prefix + ".");
		}
		else
		{
			String next = VariableOrFunctionName(parser, nullptr);
			if (next.empty())
			{
				if (!address_prefix.empty())
					parser.Emit(Instruction::Literal, Variant(address_prefix));
				return address_prefix;
			}
			return VariableExpression(parser, address_prefix + next);
		}
	}